

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void leveldb::log::_Test_TruncatedTrailingRecordIsIgnored::_RunIt(void)

{
  _Test_TruncatedTrailingRecordIsIgnored t;
  LogTest LStack_98;
  
  LogTest::LogTest(&LStack_98);
  _Run((_Test_TruncatedTrailingRecordIsIgnored *)&LStack_98);
  LogTest::~LogTest(&LStack_98);
  return;
}

Assistant:

TEST(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}